

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O2

void __thiscall
PenguinV_Image::ImageTemplate<float>::ImageTemplate
          (ImageTemplate<float> *this,uint32_t width_,uint32_t height_,uint8_t colorCount_,
          uint8_t alignment_)

{
  this->_vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001b3d28;
  this->_width = 0;
  this->_height = 0;
  this->_colorCount = '\x01';
  this->_alignment = '\x01';
  this->_rowSize = 0;
  this->_data = (float *)0x0;
  this->_type = '\0';
  _setType(this,'\0',_allocateMemory,_deallocateMemory,_copyMemory,_setMemory);
  setColorCount(this,colorCount_);
  setAlignment(this,alignment_);
  resize(this,width_,height_);
  return;
}

Assistant:

ImageTemplate( uint32_t width_ = 0u, uint32_t height_ = 0u, uint8_t colorCount_ = 1u, uint8_t alignment_ = 1u )
            : _width     ( 0 )       // width of image
            , _height    ( 0 )       // height of image
            , _colorCount( 1 )       // number of colors per pixel
            , _alignment ( 1 )       // some formats require that row size must be a multiple of some value (alignment)
                                     // for example for Bitmap it must be a multiple of 4
            , _rowSize   ( 0 )       // size of single row on image, usually it is equal to width
            , _data      ( nullptr ) // an array what store image information (pixel data)
            , _type      ( 0 )       // special attribute to specify different types of images based on technology it is used for
        {
            _setType();

            setColorCount( colorCount_ );
            setAlignment( alignment_ );
            resize( width_, height_ );
        }